

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O1

void __thiscall pg::TLQSolver::solve(TLQSolver *this,bitset *SG,int vtop,int pe,int po)

{
  pointer *pppbVar1;
  ulong *puVar2;
  size_t __n;
  uint uVar3;
  iterator iVar4;
  pointer ppbVar5;
  bitset *Z;
  bitset *pbVar6;
  long lVar7;
  pointer piVar8;
  uint *puVar9;
  char cVar10;
  byte bVar11;
  undefined8 Z_00;
  uint64_t *puVar12;
  uint64_t *puVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  string **ppsVar17;
  uint64_t *puVar18;
  ostream *poVar19;
  long *plVar20;
  uint64_t *puVar21;
  size_t sVar22;
  pointer ppbVar23;
  void *pvVar24;
  void *__dest;
  int iVar25;
  long lVar26;
  int *piVar27;
  int *piVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  uint pl;
  ulong uVar32;
  bitset *pbVar33;
  uint64_t *puVar34;
  size_t sVar35;
  uint uVar36;
  ulong uVar37;
  int *piVar38;
  vector<int,_std::allocator<int>_> *pvVar39;
  bool bVar40;
  bitset R;
  bitset H;
  undefined1 local_138 [88];
  bitset local_e0;
  bitset *local_c0;
  uint64_t *local_b8;
  bitset local_b0;
  bitset *local_90;
  bitset *local_88;
  uint64_t *local_80;
  bitset *local_78;
  int *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  bitset *local_60;
  int *local_58;
  vector<pg::bitset_*,_std::allocator<pg::bitset_*>_> *local_50;
  bitset *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  ulong local_38;
  
  ppsVar17 = (string **)(ulong)(uint)vtop;
  this->iterations = this->iterations + 1;
  if (po < 1) {
    sVar35 = (this->W0)._bitssize;
    if (sVar35 != 0) {
      puVar21 = SG->_bits;
      puVar34 = (this->W0)._bits;
      sVar22 = 0;
      do {
        puVar2 = puVar34 + sVar22;
        *puVar2 = *puVar2 | puVar21[sVar22];
        sVar22 = sVar22 + 1;
      } while (sVar35 != sVar22);
    }
    if ((this->super_Solver).trace < 2) {
      return;
    }
    sVar35 = 0;
    do {
      sVar22 = sVar35;
      if (SG->_bitssize == sVar22) {
        return;
      }
      sVar35 = sVar22 + 1;
    } while (SG->_bits[sVar22] == 0);
    if (SG->_bitssize == sVar22) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_Solver).logger,"presumed won by player 0:",0x19);
    if (-1 < vtop) {
      do {
        if ((SG->_bits[(ulong)ppsVar17 >> 6] >> ((ulong)ppsVar17 & 0x3f) & 1) != 0) {
          poVar19 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;38m",0xb);
          local_b0._bits = (uint64_t *)(this->super_Solver).game;
          local_b0._size = CONCAT44(local_b0._size._4_4_,(int)ppsVar17);
          poVar19 = operator<<(poVar19,(_label_vertex *)&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
        }
        bVar40 = 0 < (long)ppsVar17;
        ppsVar17 = (string **)((long)ppsVar17 - 1);
      } while (bVar40);
    }
LAB_0017a4b4:
    poVar19 = (this->super_Solver).logger;
    cVar10 = (char)poVar19;
    std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + cVar10);
    std::ostream::put(cVar10);
    std::ostream::flush();
    return;
  }
  puVar21 = (uint64_t *)(ulong)(uint)pe;
  if (pe < 1) {
    sVar35 = (this->W1)._bitssize;
    if (sVar35 != 0) {
      puVar21 = SG->_bits;
      puVar34 = (this->W1)._bits;
      sVar22 = 0;
      do {
        puVar2 = puVar34 + sVar22;
        *puVar2 = *puVar2 | puVar21[sVar22];
        sVar22 = sVar22 + 1;
      } while (sVar35 != sVar22);
    }
    if ((this->super_Solver).trace < 2) {
      return;
    }
    sVar35 = 0;
    do {
      sVar22 = sVar35;
      if (SG->_bitssize == sVar22) {
        return;
      }
      sVar35 = sVar22 + 1;
    } while (SG->_bits[sVar22] == 0);
    if (SG->_bitssize == sVar22) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_Solver).logger,"presumed won by player 1:",0x19);
    if (-1 < vtop) {
      do {
        if ((SG->_bits[(ulong)ppsVar17 >> 6] >> ((ulong)ppsVar17 & 0x3f) & 1) != 0) {
          poVar19 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;38m",0xb);
          local_b0._bits = (uint64_t *)(this->super_Solver).game;
          local_b0._size = CONCAT44(local_b0._size._4_4_,(int)ppsVar17);
          poVar19 = operator<<(poVar19,(_label_vertex *)&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
        }
        bVar40 = 0 < (long)ppsVar17;
        ppsVar17 = (string **)((long)ppsVar17 - 1);
      } while (bVar40);
    }
    goto LAB_0017a4b4;
  }
  puVar34 = (uint64_t *)(ulong)(uint)po;
  uVar32 = (ulong)vtop;
  if (((SG->_bits[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) == 0) &&
     (ppsVar17 = (string **)bitset::find_prev(SG,uVar32), (int)ppsVar17 == -1)) {
    return;
  }
  local_68 = &this->Ps;
  iVar4._M_current =
       (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  uVar32 = (ulong)(int)ppsVar17;
  if ((ulong)((long)iVar4._M_current -
              (long)(this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) <
      (ulong)((long)(this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3)) {
    iVar15 = ((this->super_Solver).game)->_priority[uVar32];
    local_b0._bits = (uint64_t *)CONCAT44(local_b0._bits._4_4_,iVar15);
    if (iVar4._M_current ==
        (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (local_68,iVar4,(int *)&local_b0);
    }
    else {
      *iVar4._M_current = iVar15;
      (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = iVar4._M_current + 1;
    }
    puVar18 = (uint64_t *)bitset::count(SG);
    puVar12 = puVar34;
    do {
      puVar34 = puVar12;
      puVar12 = (uint64_t *)((ulong)puVar34 >> 1);
      puVar13 = puVar21;
    } while (puVar18 < (uint64_t *)((ulong)puVar34 >> 1));
    do {
      puVar21 = puVar13;
      puVar13 = (uint64_t *)((ulong)puVar21 >> 1);
    } while (puVar18 < (uint64_t *)((ulong)puVar21 >> 1));
  }
  local_138._52_4_ =
       (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish[-1];
  if ((local_138._52_4_ & 1) == 0) {
    iVar15 = (int)((ulong)puVar34 >> 1);
    iVar25 = (int)puVar21;
  }
  else {
    iVar25 = (int)((ulong)puVar21 >> 1);
    iVar15 = (int)puVar34;
  }
  solve(this,SG,(int)ppsVar17,iVar25,iVar15);
  pl = local_138._52_4_ & 1;
  local_b8 = puVar34;
  if (1 < (this->super_Solver).trace) {
    poVar19 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"in pr=",6);
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_138._52_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", pe=",5);
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)puVar21);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,", po=",5);
    plVar20 = (long *)std::ostream::operator<<(poVar19,(int)local_b8);
    std::ios::widen((char)*(undefined8 *)(*plVar20 + -0x18) + (char)plVar20);
    std::ostream::put((char)plVar20);
    std::ostream::flush();
  }
  local_88 = &this->W0;
  local_90 = &this->W1;
  local_138._64_8_ = local_88;
  local_78 = local_90;
  if (pl == 0) {
    local_138._64_8_ = local_90;
    local_78 = local_88;
  }
  if (((SG->_bits[uVar32 >> 6] >> ((ulong)ppsVar17 & 0x3f) & 1) == 0) &&
     (ppsVar17 = (string **)bitset::find_prev(SG,uVar32), (int)ppsVar17 == -1)) {
    return;
  }
  local_b0._size = ((this->super_Solver).game)->n_vertices;
  uVar37 = local_b0._size + 0x3f;
  local_b0._bitssize = uVar37 >> 6;
  uVar32 = local_b0._bitssize << 3;
  local_b0._allocsize = uVar32;
  local_80 = puVar21;
  local_b0._bits = (uint64_t *)operator_new__(uVar32);
  if (0x3f < uVar37) {
    memset(local_b0._bits,0,uVar32);
  }
  local_50 = &this->Hs;
  local_138._0_8_ = &local_b0;
  std::vector<pg::bitset*,std::allocator<pg::bitset*>>::emplace_back<pg::bitset*>
            ((vector<pg::bitset*,std::allocator<pg::bitset*>> *)local_50,(bitset **)local_138);
  local_138._0_4_ = (int)ppsVar17;
  local_138._56_8_ = ppsVar17;
  if ((int)ppsVar17 != -1) {
    local_138._40_8_ = &this->heads;
    do {
      iVar15 = (int)ppsVar17;
      uVar32 = (ulong)(long)iVar15 >> 6;
      if (((SG->_bits[uVar32] >> ((ulong)ppsVar17 & 0x3f) & 1) != 0) &&
         ((local_b0._bits[uVar32] & 1L << ((ulong)ppsVar17 & 0x3f)) == 0)) {
        if ((((this->super_Solver).game)->_priority[iVar15] & 1U) != pl) break;
        iVar4._M_current =
             (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_138._40_8_,iVar4,(int *)local_138);
        }
        else {
          *iVar4._M_current = iVar15;
          (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        uVar32 = (ulong)(int)local_138._0_4_;
        local_b0._bits[uVar32 >> 6] = local_b0._bits[uVar32 >> 6] | 1L << (uVar32 & 0x3f);
        this->str[uVar32] = -1;
        iVar15 = (this->Q).pointer;
        (this->Q).pointer = iVar15 + 1;
        (this->Q).queue[iVar15] = local_138._0_4_;
        while( true ) {
          iVar15 = (this->Q).pointer;
          if ((long)iVar15 == 0) break;
          (this->Q).pointer = iVar15 + -1;
          uVar3 = (this->Q).queue[(long)iVar15 + -1];
          attractVertices(this,pl,uVar3,&local_b0,SG,SG);
          attractTangles(this,pl,uVar3,SG,&local_b0,SG);
        }
      }
      bVar40 = local_138._0_4_ != 0;
      ppsVar17 = (string **)(ulong)(local_138._0_4_ - 1);
      local_138._0_4_ = local_138._0_4_ - 1;
    } while (bVar40);
  }
  if ((this->super_Solver).trace != 0) {
    poVar19 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[1;33mregion \x1b[36m",0x13);
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_138._52_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
    sVar35 = 0xffffffffffffffff;
    if ((uint64_t *)local_b0._bitssize != (uint64_t *)0x0) {
      lVar26 = local_b0._bitssize * -0x40;
      puVar21 = (uint64_t *)local_b0._bitssize;
      do {
        lVar26 = lVar26 + 0x40;
        if (local_b0._bits[(long)puVar21 - 1] != 0) {
          sVar35 = LZCOUNT(local_b0._bits[(long)puVar21 - 1]) - lVar26 ^ 0x3f;
          break;
        }
        puVar21 = (uint64_t *)((long)puVar21 - 1);
      } while (puVar21 != (uint64_t *)0x0);
    }
    bVar11 = (byte)local_138._52_4_;
    for (; poVar19 = (this->super_Solver).logger, sVar35 != 0xffffffffffffffff;
        sVar35 = bitset::find_prev(&local_b0,sVar35)) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;38m",0xb);
      local_138._8_4_ = (int)sVar35;
      local_138._0_8_ = (this->super_Solver).game;
      poVar19 = operator<<(poVar19,(_label_vertex *)local_138);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
      if ((1 < (this->super_Solver).trace) &&
         ((((((this->super_Solver).game)->_owner)._bits[(ulong)(long)(int)sVar35 >> 6] >>
            (sVar35 & 0x3f) & 1) == 0) != (bool)(bVar11 & 1))) {
        poVar19 = (this->super_Solver).logger;
        if (this->str[sVar35] == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar19,"\x1b[38;5;37m\x1b[33m=>\x1b[38;5;37m-\x1b[m",0x1f);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar19,"\x1b[33m=>\x1b[38;5;37m =>",0x14);
          local_138._8_4_ = this->str[sVar35];
          local_138._0_8_ = (this->super_Solver).game;
          poVar19 = operator<<(poVar19,(_label_vertex *)local_138);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
        }
      }
    }
    std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
    std::ostream::put((char)poVar19);
    std::ostream::flush();
  }
  piVar28 = (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_70 = (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (piVar28 != local_70) {
    piVar27 = piVar28;
    do {
      piVar38 = piVar27 + 1;
      bVar14 = attracts(this,pl,*piVar27,&local_b0,SG);
      bVar40 = false;
      if (!bVar14) {
        bVar40 = true;
        break;
      }
      piVar27 = piVar38;
    } while (piVar38 != local_70);
    if (bVar40) goto LAB_0017b5f8;
  }
  lVar26 = ((this->super_Solver).game)->n_vertices;
  if (lVar26 != 0) {
    memset(this->pea_vidx,0,lVar26 << 2);
  }
  this->pea_curidx = 1;
  if (piVar28 != local_70) {
    local_138._80_8_ = &this->S;
    local_60 = &this->G;
    do {
      uVar31 = this->dominions;
      uVar36 = this->tangles;
      local_58 = piVar28;
      extractTangles(this,*piVar28,&local_b0);
      if (uVar31 != this->dominions) {
        sVar35 = (this->S)._bitssize;
        sVar22 = 0xffffffffffffffff;
        if (sVar35 != 0) {
          lVar26 = sVar35 * -0x40;
          do {
            lVar26 = lVar26 + 0x40;
            if ((*(uint64_t **)local_138._80_8_)[sVar35 - 1] != 0) {
              sVar22 = LZCOUNT((*(uint64_t **)local_138._80_8_)[sVar35 - 1]) - lVar26 ^ 0x3f;
              break;
            }
            sVar35 = sVar35 - 1;
          } while (sVar35 != 0);
        }
        for (; sVar22 != 0xffffffffffffffff;
            sVar22 = bitset::find_prev((bitset *)local_138._80_8_,sVar22)) {
          iVar15 = (this->Q).pointer;
          (this->Q).pointer = iVar15 + 1;
          (this->Q).queue[iVar15] = (uint)sVar22;
        }
        while( true ) {
          iVar15 = (this->Q).pointer;
          if ((long)iVar15 == 0) break;
          (this->Q).pointer = iVar15 + -1;
          uVar3 = (this->Q).queue[(long)iVar15 + -1];
          attractVertices(this,pl,uVar3,(bitset *)local_138._80_8_,local_60,local_60);
          attractTangles(this,pl,uVar3,local_60,(bitset *)local_138._80_8_,local_60);
        }
        sVar35 = local_78->_bitssize;
        if (sVar35 != 0) {
          puVar21 = *(uint64_t **)local_138._80_8_;
          puVar34 = local_78->_bits;
          sVar22 = 0;
          do {
            puVar34[sVar22] = puVar34[sVar22] | puVar21[sVar22];
            sVar22 = sVar22 + 1;
          } while (sVar35 != sVar22);
        }
        sVar35 = *(size_t *)(local_138._64_8_ + 0x10);
        if (sVar35 != 0) {
          puVar21 = *(uint64_t **)local_138._80_8_;
          puVar34 = *(uint64_t **)local_138._64_8_;
          sVar22 = 0;
          do {
            puVar34[sVar22] = puVar34[sVar22] & ~puVar21[sVar22];
            sVar22 = sVar22 + 1;
          } while (sVar35 != sVar22);
        }
        sVar35 = (this->G)._bitssize;
        if (sVar35 != 0) {
          puVar21 = (this->G)._bits;
          puVar34 = (this->S)._bits;
          sVar22 = 0;
          do {
            puVar2 = puVar21 + sVar22;
            *puVar2 = *puVar2 & ~puVar34[sVar22];
            sVar22 = sVar22 + 1;
          } while (sVar35 != sVar22);
        }
        sVar35 = (this->S)._bitssize;
        if (sVar35 != 0) {
          memset(*(uint64_t **)local_138._80_8_,0,sVar35 << 3);
        }
      }
      if (((uVar31 != this->dominions) || (uVar36 != this->tangles)) &&
         (ppbVar23 = (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
         (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
         super__Vector_impl_data._M_finish != ppbVar23)) {
        uVar32 = 0;
        do {
          local_138._40_4_ =
               (local_68->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar32];
          pbVar33 = ppbVar23[uVar32];
          ppbVar5 = (local_50->super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          Z = ppbVar5[uVar32];
          local_138._0_32_ = ZEXT1632(ZEXT816(0) << 0x40);
          local_38 = uVar32;
          if ((int)uVar32 == 0) {
            sVar35 = pbVar33->_bitssize;
            if (sVar35 != 0) {
              puVar21 = (this->G)._bits;
              puVar34 = pbVar33->_bits;
              sVar22 = 0;
              do {
                puVar34[sVar22] = puVar34[sVar22] & puVar21[sVar22];
                sVar22 = sVar22 + 1;
              } while (sVar35 != sVar22);
            }
            local_c0 = (bitset *)(this->G)._size;
            piVar28 = (int *)(this->G)._bitssize;
            local_138._72_8_ = (long)piVar28 * 8;
            pvVar39 = (vector<int,_std::allocator<int>_> *)local_138._72_8_;
            if ((int *)0x1fffffffffffffff < piVar28) {
              pvVar39 = (vector<int,_std::allocator<int>_> *)0xffffffffffffffff;
            }
            pvVar24 = operator_new__((ulong)pvVar39);
            if (piVar28 != (int *)0x0) {
              memmove(pvVar24,(this->G)._bits,local_138._72_8_);
              puVar21 = pbVar33->_bits;
              piVar27 = (int *)0x0;
              do {
                puVar2 = (ulong *)((long)pvVar24 + (long)piVar27 * 8);
                *puVar2 = *puVar2 & ~puVar21[(long)piVar27];
                piVar27 = (int *)((long)piVar27 + 1);
              } while (piVar28 != piVar27);
            }
            local_e0._size = (size_t)local_c0;
            local_e0._allocsize = local_138._72_8_;
            local_e0._bitssize = (size_t)piVar28;
            local_e0._bits = (uint64_t *)operator_new__((ulong)pvVar39);
            if (piVar28 != (int *)0x0) {
              memcpy(local_e0._bits,pvVar24,local_138._72_8_);
            }
            operator_delete__(pvVar24);
            bitset::operator=((bitset *)local_138,(bitset *)(local_138 + 0x58));
            if ((Game *)local_e0._bits != (Game *)0x0) {
              operator_delete__(local_e0._bits);
            }
          }
          else {
            uVar31 = (int)uVar32 - 1;
            pbVar6 = ppbVar23[uVar31];
            local_48 = ppbVar5[uVar31];
            local_40 = (vector<int,_std::allocator<int>_> *)pbVar6->_size;
            piVar28 = (int *)pbVar6->_bitssize;
            local_138._72_8_ = (long)piVar28 * 8;
            local_c0 = (bitset *)local_138._72_8_;
            if ((int *)0x1fffffffffffffff < piVar28) {
              local_c0 = (bitset *)0xffffffffffffffff;
            }
            pvVar24 = operator_new__((ulong)local_c0);
            if (piVar28 != (int *)0x0) {
              memmove(pvVar24,pbVar6->_bits,local_138._72_8_);
              puVar21 = local_48->_bits;
              piVar27 = (int *)0x0;
              do {
                puVar2 = (ulong *)((long)pvVar24 + (long)piVar27 * 8);
                *puVar2 = *puVar2 & ~puVar21[(long)piVar27];
                piVar27 = (int *)((long)piVar27 + 1);
              } while (piVar28 != piVar27);
            }
            __dest = operator_new__((ulong)local_c0);
            if (piVar28 != (int *)0x0) {
              memcpy(__dest,pvVar24,local_138._72_8_);
            }
            operator_delete__(pvVar24);
            sVar35 = pbVar33->_bitssize;
            if (sVar35 != 0) {
              puVar21 = pbVar33->_bits;
              sVar22 = 0;
              do {
                puVar21[sVar22] = puVar21[sVar22] & *(ulong *)((long)__dest + sVar22 * 8);
                sVar22 = sVar22 + 1;
              } while (sVar35 != sVar22);
            }
            pvVar24 = operator_new__((ulong)local_c0);
            if (piVar28 != (int *)0x0) {
              memcpy(pvVar24,__dest,local_138._72_8_);
              puVar21 = pbVar33->_bits;
              piVar27 = (int *)0x0;
              do {
                puVar2 = (ulong *)((long)pvVar24 + (long)piVar27 * 8);
                *puVar2 = *puVar2 & ~puVar21[(long)piVar27];
                piVar27 = (int *)((long)piVar27 + 1);
              } while (piVar28 != piVar27);
            }
            local_e0._size = (size_t)local_40;
            local_e0._allocsize = local_138._72_8_;
            local_e0._bitssize = (size_t)piVar28;
            local_e0._bits = (uint64_t *)operator_new__((ulong)local_c0);
            if (piVar28 != (int *)0x0) {
              memcpy(local_e0._bits,pvVar24,local_138._72_8_);
            }
            operator_delete__(pvVar24);
            bitset::operator=((bitset *)local_138,(bitset *)(local_138 + 0x58));
            if ((Game *)local_e0._bits != (Game *)0x0) {
              operator_delete__(local_e0._bits);
            }
            operator_delete__(__dest);
          }
          sVar35 = 0xffffffffffffffff;
          if ((int *)local_138._16_8_ != (int *)0x0) {
            lVar26 = local_138._16_8_ * -0x40;
            piVar28 = (int *)local_138._16_8_;
            do {
              lVar26 = lVar26 + 0x40;
              lVar7 = *(long *)(local_138._0_8_ + (long)piVar28 * 8 + -8);
              if (lVar7 != 0) {
                sVar35 = LZCOUNT(lVar7) - lVar26 ^ 0x3f;
                break;
              }
              piVar28 = (int *)((long)piVar28 - 1);
            } while (piVar28 != (int *)0x0);
          }
          local_138._40_8_ = local_138._40_8_ & 0xffffffff00000001;
          for (; sVar35 != 0xffffffffffffffff;
              sVar35 = bitset::find_prev((bitset *)local_138,sVar35)) {
            iVar15 = (this->Q).pointer;
            (this->Q).pointer = iVar15 + 1;
            (this->Q).queue[iVar15] = (uint)sVar35;
          }
          uVar31 = local_138._40_4_ ^ 1;
          while( true ) {
            uVar32 = local_38;
            iVar15 = (this->Q).pointer;
            if ((long)iVar15 == 0) break;
            (this->Q).pointer = iVar15 + -1;
            uVar3 = (this->Q).queue[(long)iVar15 + -1];
            attractVertices(this,uVar31,uVar3,(bitset *)local_138,pbVar33,pbVar33);
            attractTangles(this,uVar31,uVar3,pbVar33,(bitset *)local_138,pbVar33);
          }
          sVar35 = pbVar33->_bitssize;
          if (sVar35 != 0) {
            puVar21 = pbVar33->_bits;
            sVar22 = 0;
            do {
              puVar21[sVar22] = puVar21[sVar22] & ~(ulong)((uint64_t **)local_138._0_8_)[sVar22];
              sVar22 = sVar22 + 1;
            } while (sVar35 != sVar22);
          }
          local_138._72_8_ = local_88;
          if (local_138._40_4_ == 0) {
            local_138._72_8_ = local_90;
          }
          sVar35 = ((bitset *)local_138._72_8_)->_bitssize;
          if (sVar35 != 0) {
            puVar21 = ((bitset *)local_138._72_8_)->_bits;
            sVar22 = 0;
            do {
              puVar21[sVar22] = puVar21[sVar22] | (ulong)((uint64_t **)local_138._0_8_)[sVar22];
              sVar22 = sVar22 + 1;
            } while (sVar35 != sVar22);
          }
          local_c0 = local_90;
          if (local_138._40_4_ == 0) {
            local_c0 = local_88;
          }
          sVar35 = local_c0->_bitssize;
          if (sVar35 != 0) {
            puVar21 = local_c0->_bits;
            sVar22 = 0;
            do {
              puVar21[sVar22] = puVar21[sVar22] & ~(ulong)((uint64_t **)local_138._0_8_)[sVar22];
              sVar22 = sVar22 + 1;
            } while (sVar35 != sVar22);
          }
          if (1 < (this->super_Solver).trace) {
            poVar19 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[1;33mlevel ",0xd);
            poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"-R\x1b[m",5);
            sVar35 = pbVar33->_bitssize;
            sVar22 = 0xffffffffffffffff;
            if (sVar35 != 0) {
              lVar26 = sVar35 * -0x40;
              do {
                lVar26 = lVar26 + 0x40;
                if (pbVar33->_bits[sVar35 - 1] != 0) {
                  sVar22 = LZCOUNT(pbVar33->_bits[sVar35 - 1]) - lVar26 ^ 0x3f;
                  break;
                }
                sVar35 = sVar35 - 1;
              } while (sVar35 != 0);
            }
            for (; poVar19 = (this->super_Solver).logger, sVar22 != 0xffffffffffffffff;
                sVar22 = bitset::find_prev(pbVar33,sVar22)) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;38m",0xb);
              local_e0._bits = (uint64_t *)(this->super_Solver).game;
              local_e0._size = CONCAT44(local_e0._size._4_4_,(int)sVar22);
              poVar19 = operator<<(poVar19,(_label_vertex *)(local_138 + 0x58));
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
            }
            std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
            std::ostream::put((char)poVar19);
            std::ostream::flush();
          }
          if (1 < (this->super_Solver).trace) {
            poVar19 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[1;33mlevel ",0xd);
            poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"-U\x1b[m",5);
            sVar35 = 0xffffffffffffffff;
            if ((int *)local_138._16_8_ != (int *)0x0) {
              lVar26 = local_138._16_8_ * -0x40;
              piVar28 = (int *)local_138._16_8_;
              do {
                lVar26 = lVar26 + 0x40;
                lVar7 = *(long *)(local_138._0_8_ + (long)piVar28 * 8 + -8);
                if (lVar7 != 0) {
                  sVar35 = LZCOUNT(lVar7) - lVar26 ^ 0x3f;
                  break;
                }
                piVar28 = (int *)((long)piVar28 - 1);
              } while (piVar28 != (int *)0x0);
            }
            for (; poVar19 = (this->super_Solver).logger, sVar35 != 0xffffffffffffffff;
                sVar35 = bitset::find_prev((bitset *)local_138,sVar35)) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;38m",0xb);
              local_e0._bits = (uint64_t *)(this->super_Solver).game;
              local_e0._size = CONCAT44(local_e0._size._4_4_,(int)sVar35);
              poVar19 = operator<<(poVar19,(_label_vertex *)(local_138 + 0x58));
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
            }
            std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
            std::ostream::put((char)poVar19);
            std::ostream::flush();
          }
          sVar35 = Z->_bitssize;
          if (sVar35 != 0) {
            puVar21 = pbVar33->_bits;
            puVar34 = Z->_bits;
            sVar22 = 0;
            do {
              puVar34[sVar22] = puVar34[sVar22] & puVar21[sVar22];
              sVar22 = sVar22 + 1;
            } while (sVar35 != sVar22);
          }
          sVar35 = Z->_bitssize;
          sVar22 = 0xffffffffffffffff;
          if (sVar35 != 0) {
            lVar26 = sVar35 * -0x40;
            do {
              lVar26 = lVar26 + 0x40;
              if (Z->_bits[sVar35 - 1] != 0) {
                sVar22 = LZCOUNT(Z->_bits[sVar35 - 1]) - lVar26 ^ 0x3f;
                break;
              }
              sVar35 = sVar35 - 1;
            } while (sVar35 != 0);
          }
          for (; sVar22 != 0xffffffffffffffff; sVar22 = bitset::find_prev(Z,sVar22)) {
            iVar15 = (this->Q).pointer;
            (this->Q).pointer = iVar15 + 1;
            (this->Q).queue[iVar15] = (uint)sVar22;
          }
          while( true ) {
            iVar15 = (this->Q).pointer;
            if ((long)iVar15 == 0) break;
            (this->Q).pointer = iVar15 + -1;
            uVar3 = (this->Q).queue[(long)iVar15 + -1];
            attractVertices(this,local_138._40_4_,uVar3,Z,pbVar33,pbVar33);
            attractTangles(this,local_138._40_4_,uVar3,pbVar33,Z,pbVar33);
          }
          sVar35 = local_c0->_bitssize;
          if (sVar35 != 0) {
            puVar21 = Z->_bits;
            puVar34 = local_c0->_bits;
            sVar22 = 0;
            do {
              puVar34[sVar22] = puVar34[sVar22] | puVar21[sVar22];
              sVar22 = sVar22 + 1;
            } while (sVar35 != sVar22);
          }
          sVar35 = *(size_t *)(local_138._72_8_ + 0x10);
          if (sVar35 != 0) {
            puVar21 = Z->_bits;
            puVar34 = *(uint64_t **)local_138._72_8_;
            sVar22 = 0;
            do {
              puVar34[sVar22] = puVar34[sVar22] & ~puVar21[sVar22];
              sVar22 = sVar22 + 1;
            } while (sVar35 != sVar22);
          }
          if (1 < (this->super_Solver).trace) {
            poVar19 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[1;33mlevel ",0xd);
            poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"-H\x1b[m",5);
            sVar35 = Z->_bitssize;
            sVar22 = 0xffffffffffffffff;
            if (sVar35 != 0) {
              lVar26 = sVar35 * -0x40;
              do {
                lVar26 = lVar26 + 0x40;
                if (Z->_bits[sVar35 - 1] != 0) {
                  sVar22 = LZCOUNT(Z->_bits[sVar35 - 1]) - lVar26 ^ 0x3f;
                  break;
                }
                sVar35 = sVar35 - 1;
              } while (sVar35 != 0);
            }
            for (; poVar19 = (this->super_Solver).logger, sVar22 != 0xffffffffffffffff;
                sVar22 = bitset::find_prev(Z,sVar22)) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;38m",0xb);
              local_e0._bits = (uint64_t *)(this->super_Solver).game;
              local_e0._size = CONCAT44(local_e0._size._4_4_,(int)sVar22);
              poVar19 = operator<<(poVar19,(_label_vertex *)(local_138 + 0x58));
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
            }
            std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + (char)poVar19);
            std::ostream::put((char)poVar19);
            std::ostream::flush();
          }
          if ((Game *)local_138._0_8_ != (Game *)0x0) {
            operator_delete__((void *)local_138._0_8_);
          }
          uVar32 = (ulong)((int)uVar32 + 1);
          ppbVar23 = (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        } while (uVar32 < (ulong)((long)(this->Rs).
                                        super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppbVar23
                                 >> 3));
      }
      piVar28 = local_58 + 1;
    } while (piVar28 != local_70);
  }
LAB_0017b5f8:
  piVar8 = (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar8) {
    (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar8;
  }
  sVar35 = local_78->_bitssize;
  if (sVar35 != 0) {
    puVar21 = SG->_bits;
    puVar34 = local_78->_bits;
    sVar22 = 0;
    do {
      puVar34[sVar22] = puVar34[sVar22] & ~puVar21[sVar22];
      sVar22 = sVar22 + 1;
    } while (sVar35 != sVar22);
  }
  local_138._40_8_ = (ulong)(pl << 5) + 0x1e0;
  if (1 < (this->super_Solver).trace) {
    poVar19 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar19,"\x1b[1;33mpre subgame \x1b[36m",0x18);
    poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_138._52_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
    if (-1 < (int)local_138._56_4_) {
      uVar32 = local_138._56_8_ & 0xffffffff;
      do {
        if (((local_b0._bits[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0) &&
           (((*(uint64_t **)local_138._64_8_)[uVar32 >> 6] & 1L << (uVar32 & 0x3f)) == 0)) {
          poVar19 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;46m",0xb);
          local_138._8_4_ = (int)uVar32;
          local_138._0_8_ = (this->super_Solver).game;
          poVar19 = operator<<(poVar19,(_label_vertex *)local_138);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
        }
        bVar40 = 0 < (long)uVar32;
        uVar32 = uVar32 - 1;
      } while (bVar40);
    }
    std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
    if (-1 < (int)local_138._56_4_) {
      uVar32 = local_138._56_8_ & 0xffffffff;
      do {
        if (((SG->_bits[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0) &&
           ((local_b0._bits[uVar32 >> 6] & 1L << (uVar32 & 0x3f)) == 0)) {
          poVar19 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;38m",0xb);
          local_138._8_4_ = (int)uVar32;
          local_138._0_8_ = (this->super_Solver).game;
          poVar19 = operator<<(poVar19,(_label_vertex *)local_138);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
        }
        bVar40 = 0 < (long)uVar32;
        uVar32 = uVar32 - 1;
      } while (bVar40);
    }
    std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
    if (-1 < (int)local_138._56_4_) {
      pbVar33 = (bitset *)local_138._64_8_;
      uVar32 = local_138._56_8_ & 0xffffffff;
      do {
        uVar37 = uVar32 >> 6;
        if (((SG->_bits[uVar37] >> (uVar32 & 0x3f) & 1) != 0) &&
           (uVar29 = 1L << (uVar32 & 0x3f), (pbVar33->_bits[uVar37] & uVar29) != 0)) {
          poVar19 = (this->super_Solver).logger;
          if ((*(ulong *)(*(long *)((long)&(this->super_Solver)._vptr_Solver + local_138._40_8_) +
                         uVar37 * 8) & uVar29) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;196m",0xc);
            local_138._8_4_ = (int)uVar32;
            local_138._0_8_ = (this->super_Solver).game;
            poVar19 = operator<<(poVar19,(_label_vertex *)local_138);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
            pbVar33 = (bitset *)local_138._64_8_;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;202m",0xc);
            local_138._8_4_ = (int)uVar32;
            local_138._0_8_ = (this->super_Solver).game;
            poVar19 = operator<<(poVar19,(_label_vertex *)local_138);
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
            pbVar33 = (bitset *)local_138._64_8_;
          }
        }
        bVar40 = 0 < (long)uVar32;
        uVar32 = uVar32 - 1;
      } while (bVar40);
    }
    poVar19 = (this->super_Solver).logger;
    cVar10 = (char)poVar19;
    std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + cVar10);
    std::ostream::put(cVar10);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_Solver).logger,"\x1b[1;33mgame",0xb);
    uVar31 = (int)((this->super_Solver).game)->n_vertices - 1;
    if (-1 < (int)uVar31) {
      uVar32 = (ulong)uVar31;
      do {
        if ((((this->G)._bits[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0) &&
           ((local_88->_bits[uVar32 >> 6] & 1L << (uVar32 & 0x3f)) != 0)) {
          poVar19 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;202m",0xc);
          local_138._8_4_ = (int)uVar32;
          local_138._0_8_ = (this->super_Solver).game;
          poVar19 = operator<<(poVar19,(_label_vertex *)local_138);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
        }
        bVar40 = 0 < (long)uVar32;
        uVar32 = uVar32 - 1;
      } while (bVar40);
    }
    std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
    uVar31 = (int)((this->super_Solver).game)->n_vertices - 1;
    if (-1 < (int)uVar31) {
      uVar32 = (ulong)uVar31;
      do {
        if ((((this->G)._bits[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0) &&
           ((local_90->_bits[uVar32 >> 6] & 1L << (uVar32 & 0x3f)) != 0)) {
          poVar19 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;201m",0xc);
          local_138._8_4_ = (int)uVar32;
          local_138._0_8_ = (this->super_Solver).game;
          poVar19 = operator<<(poVar19,(_label_vertex *)local_138);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
        }
        bVar40 = 0 < (long)uVar32;
        uVar32 = uVar32 - 1;
      } while (bVar40);
    }
    std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
    uVar31 = (int)((this->super_Solver).game)->n_vertices - 1;
    if (-1 < (int)uVar31) {
      uVar32 = (ulong)uVar31;
      do {
        uVar37 = uVar32 >> 6;
        if (((((this->G)._bits[uVar37] >> (uVar32 & 0x3f) & 1) != 0) &&
            (uVar29 = 1L << (uVar32 & 0x3f), (local_88->_bits[uVar37] & uVar29) == 0)) &&
           ((local_90->_bits[uVar37] & uVar29) == 0)) {
          poVar19 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;38m",0xb);
          local_138._8_4_ = (int)uVar32;
          local_138._0_8_ = (this->super_Solver).game;
          poVar19 = operator<<(poVar19,(_label_vertex *)local_138);
          std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
        }
        bVar40 = 0 < (long)uVar32;
        uVar32 = uVar32 - 1;
      } while (bVar40);
    }
    poVar19 = (this->super_Solver).logger;
    cVar10 = (char)poVar19;
    std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + cVar10);
    std::ostream::put(cVar10);
    std::ostream::flush();
  }
  sVar35 = SG->_size;
  uVar32 = SG->_bitssize;
  __n = uVar32 * 8;
  uVar37 = 0xffffffffffffffff;
  if (uVar32 < 0x2000000000000000) {
    uVar37 = __n;
  }
  pvVar24 = operator_new__(uVar37);
  if (uVar32 != 0) {
    memmove(pvVar24,SG->_bits,__n);
    uVar29 = 0;
    do {
      puVar2 = (ulong *)((long)pvVar24 + uVar29 * 8);
      *puVar2 = *puVar2 ^ local_b0._bits[uVar29];
      uVar29 = uVar29 + 1;
    } while (uVar32 != uVar29);
  }
  local_138._8_8_ = sVar35;
  local_138._16_8_ = uVar32;
  local_138._24_8_ = __n;
  puVar21 = (uint64_t *)operator_new__(uVar37);
  ppsVar17 = (string **)local_138._56_8_;
  local_138._0_8_ = puVar21;
  if (uVar32 != 0) {
    memcpy(puVar21,pvVar24,__n);
  }
  operator_delete__(pvVar24);
  uVar31 = (uint)local_b8;
  piVar28 = (int *)0x0;
  do {
    piVar27 = piVar28;
    iVar15 = (int)ppsVar17;
    if ((int *)local_138._16_8_ == piVar27) goto LAB_0017bcb5;
    piVar28 = (int *)((long)piVar27 + 1);
  } while (((uint64_t **)local_138._0_8_)[(long)piVar27] == (uint64_t *)0x0);
  if ((int *)local_138._16_8_ != piVar27) {
    local_e0._bits = (uint64_t *)local_138;
    std::vector<pg::bitset*,std::allocator<pg::bitset*>>::emplace_back<pg::bitset*>
              ((vector<pg::bitset*,std::allocator<pg::bitset*>> *)&this->Rs,
               (bitset **)(local_138 + 0x58));
    solve(this,(bitset *)local_138,iVar15,(int)local_80,uVar31);
    piVar8 = (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ppbVar23 = (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
    (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppbVar23;
    if ((ulong)((long)ppbVar23 -
                (long)(this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) <
        (ulong)((long)piVar8 -
                (long)(this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2)) {
      (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar8 + -1;
    }
  }
LAB_0017bcb5:
  Z_00 = local_138._64_8_;
  pppbVar1 = &(this->Hs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppbVar1 = *pppbVar1 + -1;
  puVar21 = SG->_bits;
  sVar35 = 0;
  do {
    sVar22 = sVar35;
    if (SG->_bitssize == sVar22) goto LAB_0017c36c;
    sVar35 = sVar22 + 1;
  } while (puVar21[sVar22] == 0);
  if (SG->_bitssize != sVar22) {
    if (-1 < iVar15) {
      puVar9 = (this->Q).queue;
      uVar32 = 0;
      do {
        if (((puVar21[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0) &&
           (((*(uint64_t **)local_138._64_8_)[uVar32 >> 6] & 1L << (uVar32 & 0x3f)) != 0)) {
          iVar25 = (this->Q).pointer;
          (this->Q).pointer = iVar25 + 1;
          puVar9[iVar25] = (uint)uVar32;
        }
        uVar32 = uVar32 + 1;
      } while (iVar15 + 1 != uVar32);
    }
    if ((this->Q).pointer == 0) {
      uVar36 = 0;
    }
    else {
      local_138._80_8_ = local_138._80_8_ & 0xffffffff00000000;
      while( true ) {
        iVar15 = (this->Q).pointer;
        if ((long)iVar15 == 0) break;
        (this->Q).pointer = iVar15 + -1;
        uVar3 = (this->Q).queue[(long)iVar15 + -1];
        uVar32 = *(ulong *)(*(long *)((long)&(this->super_Solver)._vptr_Solver + local_138._40_8_) +
                           ((ulong)(long)(int)uVar3 >> 6) * 8);
        attractVertices(this,pl ^ 1,uVar3,(bitset *)Z_00,SG,SG);
        uVar31 = local_138._80_4_ & 0xff;
        if ((uVar32 >> ((long)(int)uVar3 & 0x3fU) & 1) != 0) {
          uVar31 = 1;
        }
        local_138._80_4_ = uVar31;
        attractTangles(this,pl ^ 1,uVar3,SG,(bitset *)Z_00,SG);
      }
      uVar31 = (uint)local_b8;
      ppsVar17 = (string **)local_138._56_8_;
      uVar36 = local_138._80_4_;
    }
    iVar15 = (int)ppsVar17;
    if (1 < (this->super_Solver).trace) {
      poVar19 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar19,"\x1b[1;33mpost subgame \x1b[36m",0x19);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,local_138._52_4_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m (pe=",8);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)local_80);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19," po=",4);
      poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar31);
      std::__ostream_insert<char,std::char_traits<char>>(poVar19,")",1);
      uVar32 = (ulong)ppsVar17 & 0xffffffff;
      uVar37 = uVar32;
      if (-1 < iVar15) {
        do {
          if (((local_b0._bits[uVar37 >> 6] >> (uVar37 & 0x3f) & 1) != 0) &&
             (((*(uint64_t **)local_138._64_8_)[uVar37 >> 6] & 1L << (uVar37 & 0x3f)) == 0)) {
            poVar19 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;38m",0xb);
            local_e0._bits = (uint64_t *)(this->super_Solver).game;
            local_e0._size = CONCAT44(local_e0._size._4_4_,(int)uVar37);
            poVar19 = operator<<(poVar19,(_label_vertex *)(local_138 + 0x58));
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
          }
          bVar40 = 0 < (long)uVar37;
          uVar37 = uVar37 - 1;
        } while (bVar40);
      }
      std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
      uVar37 = uVar32;
      if (-1 < (int)local_138._56_8_) {
        do {
          uVar29 = uVar37 >> 6;
          if ((((SG->_bits[uVar29] >> (uVar37 & 0x3f) & 1) != 0) &&
              (uVar30 = 1L << (uVar37 & 0x3f), (local_b0._bits[uVar29] & uVar30) == 0)) &&
             (((*(uint64_t **)local_138._64_8_)[uVar29] & uVar30) == 0)) {
            poVar19 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;46m",0xb);
            local_e0._bits = (uint64_t *)(this->super_Solver).game;
            local_e0._size = CONCAT44(local_e0._size._4_4_,(int)uVar37);
            poVar19 = operator<<(poVar19,(_label_vertex *)(local_138 + 0x58));
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
          }
          bVar40 = 0 < (long)uVar37;
          uVar37 = uVar37 - 1;
        } while (bVar40);
      }
      std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
      if (-1 < (int)local_138._56_8_) {
        do {
          uVar37 = uVar32 >> 6;
          if (((SG->_bits[uVar37] >> (uVar32 & 0x3f) & 1) != 0) &&
             (uVar29 = 1L << (uVar32 & 0x3f),
             ((*(uint64_t **)local_138._64_8_)[uVar37] & uVar29) != 0)) {
            poVar19 = (this->super_Solver).logger;
            if ((*(ulong *)(*(long *)((long)&(this->super_Solver)._vptr_Solver + local_138._40_8_) +
                           uVar37 * 8) & uVar29) == 0) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;196m",0xc);
              local_e0._bits = (uint64_t *)(this->super_Solver).game;
              local_e0._size = CONCAT44(local_e0._size._4_4_,(int)uVar32);
              poVar19 = operator<<(poVar19,(_label_vertex *)(local_138 + 0x58));
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;202m",0xc);
              local_e0._bits = (uint64_t *)(this->super_Solver).game;
              local_e0._size = CONCAT44(local_e0._size._4_4_,(int)uVar32);
              poVar19 = operator<<(poVar19,(_label_vertex *)(local_138 + 0x58));
              std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
            }
          }
          bVar40 = 0 < (long)uVar32;
          uVar32 = uVar32 - 1;
        } while (bVar40);
      }
      poVar19 = (this->super_Solver).logger;
      cVar10 = (char)poVar19;
      std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + cVar10);
      puVar21 = local_b8;
      std::ostream::put(cVar10);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_Solver).logger,"\x1b[1;33mgame\x1b[m",0xe);
      uVar31 = (int)((this->super_Solver).game)->n_vertices - 1;
      if (-1 < (int)uVar31) {
        uVar32 = (ulong)uVar31;
        do {
          if ((((this->G)._bits[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0) &&
             ((local_88->_bits[uVar32 >> 6] & 1L << (uVar32 & 0x3f)) != 0)) {
            poVar19 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;202m",0xc);
            local_e0._bits = (uint64_t *)(this->super_Solver).game;
            local_e0._size = CONCAT44(local_e0._size._4_4_,(int)uVar32);
            poVar19 = operator<<(poVar19,(_label_vertex *)(local_138 + 0x58));
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
            puVar21 = local_b8;
          }
          bVar40 = 0 < (long)uVar32;
          uVar32 = uVar32 - 1;
        } while (bVar40);
      }
      uVar31 = (uint)puVar21;
      std::__ostream_insert<char,std::char_traits<char>>((this->super_Solver).logger," |",2);
      uVar16 = (int)((this->super_Solver).game)->n_vertices - 1;
      if (-1 < (int)uVar16) {
        uVar32 = (ulong)uVar16;
        do {
          if ((((this->G)._bits[uVar32 >> 6] >> (uVar32 & 0x3f) & 1) != 0) &&
             ((local_90->_bits[uVar32 >> 6] & 1L << (uVar32 & 0x3f)) != 0)) {
            poVar19 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar19," \x1b[38;5;201m",0xc);
            local_e0._bits = (uint64_t *)(this->super_Solver).game;
            local_e0._size = CONCAT44(local_e0._size._4_4_,(int)uVar32);
            poVar19 = operator<<(poVar19,(_label_vertex *)(local_138 + 0x58));
            std::__ostream_insert<char,std::char_traits<char>>(poVar19,"\x1b[m",3);
            puVar21 = local_b8;
          }
          uVar31 = (uint)puVar21;
          bVar40 = 0 < (long)uVar32;
          uVar32 = uVar32 - 1;
        } while (bVar40);
      }
      poVar19 = (this->super_Solver).logger;
      cVar10 = (char)poVar19;
      std::ios::widen((char)poVar19->_vptr_basic_ostream[-3] + cVar10);
      iVar15 = (int)local_138._56_8_;
      std::ostream::put(cVar10);
      std::ostream::flush();
    }
    if ((uVar36 & 1) != 0) {
      sVar35 = local_78->_bitssize;
      if (sVar35 != 0) {
        puVar21 = SG->_bits;
        puVar34 = local_78->_bits;
        sVar22 = 0;
        do {
          puVar34[sVar22] = puVar34[sVar22] & ~puVar21[sVar22];
          sVar22 = sVar22 + 1;
        } while (sVar35 != sVar22);
      }
      sVar35 = SG->_bitssize;
      if (sVar35 != 0) {
        puVar21 = *(uint64_t **)local_138._64_8_;
        puVar34 = SG->_bits;
        sVar22 = 0;
        do {
          puVar34[sVar22] = puVar34[sVar22] & ~puVar21[sVar22];
          sVar22 = sVar22 + 1;
        } while (sVar35 != sVar22);
      }
      sVar35 = 0;
      do {
        sVar22 = sVar35;
        if (SG->_bitssize == sVar22) goto LAB_0017c36c;
        sVar35 = sVar22 + 1;
      } while (SG->_bits[sVar22] == 0);
      if (SG->_bitssize != sVar22) {
        solve(this,SG,iVar15,(uint)local_80 >> pl,uVar31 >> ((byte)pl ^ 1));
      }
    }
  }
LAB_0017c36c:
  if ((Game *)local_138._0_8_ != (Game *)0x0) {
    operator_delete__((void *)local_138._0_8_);
  }
  if (local_b0._bits == (uint64_t *)0x0) {
    return;
  }
  operator_delete__(local_b0._bits);
  return;
}

Assistant:

void
TLQSolver::solve(bitset &SG, int vtop, int pe, int po)
{
    /**
     * This is based on a universal tree of height pr/2, with parameter n associated with pe or po
     */

    iterations++;  // record the number of recursive calls (visits)

    /**
     * If precision is 0 for a player, it means we are only looking for tangles of size <= 0,
     * that is, we presume everything is won by the other player.
     */

    if (po <= 0) {
        W0 |= SG;

#ifndef NDEBUG
        if (trace>=2 and SG.any()) {
            logger << "presumed won by player 0:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
            }
            logger << std::endl;
        }
#endif

        return;
    }

    if (pe <= 0) {
        W1 |= SG;

#ifndef NDEBUG
        if (trace>=2 and SG.any()) {
            logger << "presumed won by player 1:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
            }
            logger << std::endl;
        }
#endif

        return;
    }

    /**
     * Move <vtop> to the true top (highest vertex that is in SG)
     */

    if (!SG[vtop]) {
        vtop = SG.find_prev(vtop);
        if (((size_t)vtop) == bitset::npos) return;
    }

    /**
     * Obtain the priority and player of the subgame
     */

    if (Ps.size() < Rs.size()) {
        Ps.push_back(priority(vtop));
        // optimisation when we enter this method for the first time!
        auto size = SG.count();
        while ((size_t)(po/2) > size) po/=2;
        while ((size_t)(pe/2) > size) pe/=2;
    }

    const int pr = Ps.back();
    const int pl = pr&1;

    /**
     * Expand the left side of the current level of the universal tree
     */

    if (pl == 0) {
        solve(SG, vtop, pe, po/2);
    } else {
        solve(SG, vtop, pe/2, po);
    }

#ifndef NDEBUG
    if (trace >= 2) logger << "in pr=" << pr << ", pe=" << pe << ", po=" << po << std::endl;
#endif

    auto &Wm = pl == 0 ? W0 : W1; // my W
    auto &Wo = pl == 0 ? W1 : W0; // opponent's W

    /**
     * Update vtop to the highest vertex in the intersection
     */

    if (!SG[vtop]) {
        vtop = SG.find_prev(vtop);
        if (((size_t)vtop) == bitset::npos) return;
    }

    /**
     * Compute H := Attr(vertices of <pr> in <R>)
     */

    bitset H(nodecount());
    Hs.push_back(&H);

    for (int v=vtop; v!=-1; v--) {
        if (!SG[v] || H[v]) continue;
        // if (priority(v) != pr) break; // stop attracting when we reach the next priority
        if ((priority(v)&1) != pl) break; // on-the-fly compression
        heads.push_back(v);
        H[v] = true;
        str[v] = -1;
        Q.push(v);
        while (Q.nonempty()) {
            const int u = Q.pop();
            attractVertices(pl, u, H, SG, SG);
            attractTangles(pl, u, SG, H, SG);
        }
    }

#ifndef NDEBUG
    if (trace) {
        logger << "\033[1;33mregion \033[36m" << pr << "\033[m";
        for (auto v = H.find_last(); v != bitset::npos; v = H.find_prev(v)) {
            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
            if (trace >= 2) {
                if (owner(v) == pl) {
                    if (str[v] == -1) logger << "\033[38;5;37m\033[33m=>\033[38;5;37m-\033[m";
                    else logger << "\033[33m=>\033[38;5;37m =>" << label_vertex(str[v]) << "\033[m";
                }
            }
        }
        logger << std::endl;
    }
#endif

    /**
     * Now check if H has any escapes to R-H
     */

    bool leaky = false;
    for (auto v : heads) {
        if (!attracts(pl, v, H, SG)) {
            leaky = true;
            break;
            // TODO: consider learning tangles from partially leaky regions
        }
    }

    /**
     * If not leaky, then we can learn tangles from H
     */

    if (!leaky) {
        std::fill(pea_vidx, pea_vidx+nodecount(), '\0');
        pea_curidx = 1;
        for (auto v : heads) {
            auto T = tangles, D = dominions;
            extractTangles(v, H);
            if (D != dominions) {
                // maximize the found dominions
                for (auto v = S.find_last(); v != bitset::npos; v = S.find_prev(v)) {
                    Q.push(v);
                }
                while (Q.nonempty()) {
                    const int u = Q.pop();
                    attractVertices(pl, u, S, G, G);
                    attractTangles(pl, u, G, S, G);
                }
                // remove them from the game
                Wm |= S;
                Wo -= S;
                G -= S;
                S.reset();
            }
            if (D != dominions or T != tangles) {
                // now we need to re-maximize all regions
                for (unsigned int k=0; k<Rs.size(); k++) {
                    int k_pr = Ps[k];
                    int k_pl = k_pr & 1;
                    bitset& k_R = *Rs[k];
                    bitset& k_H = *Hs[k];
                    bitset k_U;
                    // first: R[k] - H[k] >= R[k+1]
                    // and compute what remains of k_U
                    if (k == 0) {
                        k_R &= G;
                        k_U = G - k_R;
                    } else {
                        bitset SG = *Rs[k-1] - *Hs[k-1];
                        k_R &= SG;
                        k_U = SG - k_R;
                    }
                    // maximize k_U 
                    for (auto v = k_U.find_last(); v != bitset::npos; v = k_U.find_prev(v)) {
                        Q.push(v);
                    }
                    while (Q.nonempty()) {
                        const int u = Q.pop();
                        attractVertices(1-k_pl, u, k_U, k_R, k_R);
                        attractTangles(1-k_pl, u, k_R, k_U, k_R);
                    }
                    k_R -= k_U;
                    (k_pl == 1 ? W0 : W1) |= k_U;
                    (k_pl == 1 ? W1 : W0) -= k_U;
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;33mlevel " << k << "-R\033[m";
                        for (auto v = k_R.find_last(); v != bitset::npos; v = k_R.find_prev(v)) {
                            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                        }
                        logger << std::endl;
                    }
#endif
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;33mlevel " << k << "-U\033[m";
                        for (auto v = k_U.find_last(); v != bitset::npos; v = k_U.find_prev(v)) {
                            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                        }
                        logger << std::endl;
                    }
#endif
                    // maximize H
                    k_H &= k_R;
                    for (auto v = k_H.find_last(); v != bitset::npos; v = k_H.find_prev(v)) {
                        Q.push(v);
                    }
                    while (Q.nonempty()) {
                        const int u = Q.pop();
                        attractVertices(k_pl, u, k_H, k_R, k_R);
                        attractTangles(k_pl, u, k_R, k_H, k_R);
                    }
                    (k_pl == 1 ? W1 : W0) |= k_H;
                    (k_pl == 1 ? W0 : W1) -= k_H;
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;33mlevel " << k << "-H\033[m";
                        for (auto v = k_H.find_last(); v != bitset::npos; v = k_H.find_prev(v)) {
                            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                        }
                        logger << std::endl;
                    }
#endif
                }
            }
        }
    }

    heads.clear();

    // Reset Wm for vertices not in SG
    Wm -= SG;

#ifndef NDEBUG
    /**
     * If so desired, report our current status...
     */
    if (trace >= 2) {
        // Format: Subgame: [H] | [Mine in subgame] | [Theirs in subgame] | [Earlier removed from SG]
        logger << "\033[1;33mpre subgame \033[36m" << pr << "\033[m";
        for (int v=vtop; v>=0; v--) {
            if (H[v] && !Wo[v]) logger << " \033[38;5;46m" << label_vertex(v) << "\033[m";
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && !H[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && Wo[v]) {
                if (Wm[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m"; // orange -- freshly attracted
                else logger << " \033[38;5;196m" << label_vertex(v) << "\033[m"; // red
            }
        }
        logger << std::endl;
        // Format: Game [player 0] | [player 1] | [no player]
        logger << "\033[1;33mgame";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W0[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m";
        }
        logger << " |";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W1[v]) logger << " \033[38;5;201m" << label_vertex(v) << "\033[m"; // green
        }
        logger << " |";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && !W0[v] && !W1[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m"; // blue
        }
        logger << std::endl;
    }
#endif

    /**
     * Go recursive!
     */

    bitset R = SG ^ H;
    if (R.any()) {
        Rs.push_back(&R);
        solve(R, vtop, pe, po);
        Rs.pop_back();
        if (Ps.size() > Rs.size()) Ps.pop_back();
    }
    Hs.pop_back();

    if (SG.none()) return;

    /**
     * Let the opponent attract from our region...
     * The intersection of H and Wo is the opponent's subgame
     */

    bool opponent_attracted_from_us = false;
    for (int v=0; v<=vtop; v++) {
        if (SG[v] and Wo[v]) {
            Q.push(v);
        }
    }
    if (Q.nonempty()) {
        while (Q.nonempty()) {
            const int v = Q.pop();
            if (Wm[v]) opponent_attracted_from_us = true;
            attractVertices(1-pl, v, Wo, SG, SG);
            attractTangles(1-pl, v, SG, Wo, SG);
        }
    }

#ifndef NDEBUG
    /**
     * If so desired, report our current status...
     */
    if (trace >= 2) {
        // Format: Subgame: [H] | [Mine in subgame] | [Theirs in subgame] | [Earlier removed from SG]
        logger << "\033[1;33mpost subgame \033[36m" << pr << "\033[m (pe=" << pe << " po=" << po << ")";
        for (int v=vtop; v>=0; v--) {
            if (H[v] && !Wo[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m"; // blueish
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && !H[v] && !Wo[v]) logger << " \033[38;5;46m" << label_vertex(v) << "\033[m"; // green
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && Wo[v]) {
                if (Wm[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m"; // orange -- freshly attracted
                else logger << " \033[38;5;196m" << label_vertex(v) << "\033[m"; // red
            }
        }
        logger << std::endl;
        // Format: Game [player 0] | [player 1] | [no player]
        logger << "\033[1;33mgame\033[m";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W0[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m"; // blueish
        }
        logger << " |";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W1[v]) logger << " \033[38;5;201m" << label_vertex(v) << "\033[m"; // green
        }
        logger << std::endl;
    }
#endif

    /**
     * Finally, if the opponent attracted from us, then we do the right side of the universal tree.
     * Also only do this if there is anything remaining in the subgame.
     */

    if (opponent_attracted_from_us) {
        Wm -= SG;  // reset Wm prior to recursion
        SG -= Wo;  // remove opponent won vertices from subgame

        if (SG.any()) {
            // Expand the right side of the current level of the universal tree
            if (pl == 0) solve(SG, vtop, pe, po/2);
            else solve(SG, vtop, pe/2, po);
        }
    }
}